

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLAttDef.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::XMLAttDef::XMLAttDef
          (XMLAttDef *this,XMLCh *attrValue,AttTypes type,DefAttTypes defType,XMLCh *enumValues,
          MemoryManager *manager)

{
  short *psVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar4;
  CleanupType_conflict8 cleanup;
  JanitorMemFunCall<xercesc_4_0::XMLAttDef> local_40;
  XMLCh *pXVar3;
  
  (this->super_XSerializable)._vptr_XSerializable = (_func_int **)&PTR__XMLAttDef_00414728;
  this->fDefaultType = defType;
  this->fType = type;
  this->fCreateReason = NoReason;
  this->fExternalAttribute = false;
  this->fId = 0xfffffffe;
  this->fValue = (XMLCh *)0x0;
  this->fEnumeration = (XMLCh *)0x0;
  this->fMemoryManager = manager;
  local_40.fToCall = (MFPT)cleanUp;
  local_40._16_8_ = 0;
  local_40.fObject = this;
  if (attrValue == (XMLCh *)0x0) {
    pXVar3 = (XMLCh *)0x0;
  }
  else {
    sVar4 = 0;
    do {
      psVar1 = (short *)((long)attrValue + sVar4);
      sVar4 = sVar4 + 2;
    } while (*psVar1 != 0);
    iVar2 = (*manager->_vptr_MemoryManager[3])(manager,sVar4);
    pXVar3 = (XMLCh *)CONCAT44(extraout_var,iVar2);
    memcpy(pXVar3,attrValue,sVar4);
  }
  this->fValue = pXVar3;
  if (enumValues == (XMLCh *)0x0) {
    pXVar3 = (XMLCh *)0x0;
  }
  else {
    sVar4 = 0;
    do {
      psVar1 = (short *)((long)enumValues + sVar4);
      sVar4 = sVar4 + 2;
    } while (*psVar1 != 0);
    iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar4);
    pXVar3 = (XMLCh *)CONCAT44(extraout_var_00,iVar2);
    memcpy(pXVar3,enumValues,sVar4);
  }
  this->fEnumeration = pXVar3;
  local_40.fObject = (XMLAttDef *)0x0;
  JanitorMemFunCall<xercesc_4_0::XMLAttDef>::~JanitorMemFunCall(&local_40);
  return;
}

Assistant:

XMLAttDef::XMLAttDef( const XMLCh* const           attrValue
                    , const XMLAttDef::AttTypes    type
                    , const XMLAttDef::DefAttTypes defType
                    , const XMLCh* const           enumValues
                    , MemoryManager* const         manager) :

    fDefaultType(defType)
    , fType(type)
    , fCreateReason(XMLAttDef::NoReason)
    , fExternalAttribute(false)
    , fId(XMLAttDef::fgInvalidAttrId)
    , fValue(0)
    , fEnumeration(0)
    , fMemoryManager(manager)
{
    CleanupType cleanup(this, &XMLAttDef::cleanUp);

    try
    {
        fValue = XMLString::replicate(attrValue, fMemoryManager);
        fEnumeration = XMLString::replicate(enumValues, fMemoryManager);
    }
    catch(const OutOfMemoryException&)
    {
        cleanup.release();

        throw;
    }

    cleanup.release();
}